

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPTPPrinter.cpp
# Opt level: O0

void __thiscall
Shell::TPTPPrinter::printWithRole
          (TPTPPrinter *this,string *name,string *role,Unit *u,bool includeSplitLevels)

{
  ostream *poVar1;
  string *in_RDX;
  string *in_RSI;
  TPTPPrinter *in_RDI;
  byte in_R8B;
  string body;
  bool in_stack_0000020f;
  Unit *in_stack_00000210;
  TPTPPrinter *in_stack_00000218;
  Unit *in_stack_ffffffffffffff68;
  TPTPPrinter *in_stack_ffffffffffffff70;
  string local_48 [39];
  byte local_21;
  
  local_21 = in_R8B & 1;
  getBodyStr_abi_cxx11_(in_stack_00000218,in_stack_00000210,in_stack_0000020f);
  ensureHeadersPrinted(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  poVar1 = tgt(in_RDI);
  poVar1 = std::operator<<(poVar1,"tff(");
  poVar1 = std::operator<<(poVar1,in_RSI);
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = std::operator<<(poVar1,in_RDX);
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = std::operator<<(poVar1,local_48);
  poVar1 = std::operator<<(poVar1,").");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_48);
  return;
}

Assistant:

void TPTPPrinter::printWithRole(std::string name, std::string role, Unit* u, bool includeSplitLevels)
{
  std::string body = getBodyStr(u, includeSplitLevels);

  ensureHeadersPrinted(u);
  tgt() << "tff(" << name << ", " << role << ", " << body << ")." << endl;
}